

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImVec2 ImGui::TabItemCalcSize(char *label,bool has_close_button)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  undefined7 in_register_00000031;
  undefined1 auVar6 [64];
  float fVar7;
  undefined1 extraout_var [56];
  
  pIVar5 = GImGui;
  auVar6._0_8_ = CalcTextSize(label,(char *)0x0,true,-1.0);
  auVar6._8_56_ = extraout_var;
  fVar1 = (pIVar5->Style).FramePadding.x;
  fVar2 = (pIVar5->Style).FramePadding.y;
  if ((int)CONCAT71(in_register_00000031,has_close_button) == 0) {
    fVar7 = 1.0;
  }
  else {
    fVar7 = (pIVar5->Style).ItemInnerSpacing.x + pIVar5->FontSize;
  }
  auVar4 = vmovshdup_avx(auVar6._0_16_);
  auVar3 = vminss_avx(ZEXT416((uint)(auVar6._0_4_ + fVar1 + fVar1 + fVar7)),
                      ZEXT416((uint)(GImGui->FontSize * 20.0)));
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(fVar2 + fVar2 + auVar4._0_4_)),0x10);
  return auVar3._0_8_;
}

Assistant:

ImVec2 ImGui::TabItemCalcSize(const char* label, bool has_close_button)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size = ImVec2(label_size.x + g.Style.FramePadding.x, label_size.y + g.Style.FramePadding.y * 2.0f);
    if (has_close_button)
        size.x += g.Style.FramePadding.x + (g.Style.ItemInnerSpacing.x + g.FontSize); // We use Y intentionally to fit the close button circle.
    else
        size.x += g.Style.FramePadding.x + 1.0f;
    return ImVec2(ImMin(size.x, TabBarCalcMaxTabWidth()), size.y);
}